

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  int iVar2;
  Extension *pEVar3;
  undefined4 extraout_var;
  Descriptor *pDVar4;
  MessageLite *pMVar5;
  
  pEVar3 = FindOrNull(this,*(int *)(descriptor + 0x44));
  if (pEVar3 == (Extension *)0x0) {
    pMVar5 = (MessageLite *)0x0;
  }
  else {
    if ((pEVar3->field_0xa & 0x10) == 0) {
      pMVar5 = (pEVar3->field_0).message_value;
      if (this->arena_ != (Arena *)0x0) {
        iVar2 = (*pMVar5->_vptr_MessageLite[3])(pMVar5);
        pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
        (*pMVar5->_vptr_MessageLite[10])(pMVar5,(pEVar3->field_0).int64_value);
      }
    }
    else {
      pRVar1 = (pEVar3->field_0).repeated_string_value;
      pDVar4 = FieldDescriptor::message_type(descriptor);
      iVar2 = (*factory->_vptr_MessageFactory[2])(factory,pDVar4);
      pMVar5 = (MessageLite *)
               (*(code *)(((pRVar1->super_RepeatedPtrFieldBase).arena_)->impl_).options_.
                         initial_block)(pRVar1,iVar2);
      if ((this->arena_ == (Arena *)0x0) &&
         ((pEVar3->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar3->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    Erase(this,*(int *)(descriptor + 0x44));
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->ReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()));
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      if (arena_ != NULL) {
        ret = extension->message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->message_value);
      } else {
        ret = extension->message_value;
      }
    }
    Erase(descriptor->number());
    return ret;
  }
}